

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::ScanInitialImplicitRoots(HeapInfo *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *this_02;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_03;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar5;
  
  lVar5 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5),this->recycler);
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0xa878);
  lVar5 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar5),this->recycler);
    lVar5 = lVar5 + 0x380;
  } while (lVar5 != 0x10df8);
  LargeHeapBucket::ScanInitialImplicitRoots(&this->largeObjectBucket,this->recycler);
  pSVar3 = this->newNormalHeapBlockList;
  while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (pSVar3,this->recycler);
    pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    pSVar3 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
  }
  pSVar3 = &this->newNormalWithBarrierHeapBlockList->
            super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  while (pSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (pSVar3,this->recycler);
    pSVar1 = (pSVar3->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    pSVar3 = &HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock)->
              super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  }
  this_00 = this->newFinalizableWithBarrierHeapBlockList;
  while (this_00 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_00,this->recycler);
    pSVar1 = (this_00->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_00 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock);
  }
  this_01 = this->newFinalizableHeapBlockList;
  while (this_01 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_01->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
    pSVar1 = (this_01->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_01 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                        (&pSVar1->super_HeapBlock);
  }
  pSVar4 = this->newMediumNormalHeapBlockList;
  while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (pSVar4,this->recycler);
    pSVar2 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
  }
  pSVar4 = &this->newMediumNormalWithBarrierHeapBlockList->
            super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (pSVar4,this->recycler);
    pSVar2 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    pSVar4 = &HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock)->
              super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  }
  this_02 = this->newMediumFinalizableWithBarrierHeapBlockList;
  while (this_02 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_02,this->recycler);
    pSVar2 = (this_02->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_02 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock);
  }
  this_03 = this->newMediumFinalizableHeapBlockList;
  while( true ) {
    if (this_03 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_03->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
    pSVar2 = (this_03->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_03 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                        (&pSVar2->super_HeapBlock);
  }
  return;
}

Assistant:

void
HeapInfo::ScanInitialImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanInitialImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

}